

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreFilter.hpp
# Opt level: O1

Range __thiscall cppjieba::PreFilter::Next(PreFilter *this)

{
  const_iterator pRVar1;
  size_t sVar2;
  __node_base_ptr p_Var3;
  const_iterator __k;
  const_iterator pRVar4;
  Range RVar5;
  
  pRVar1 = this->cursor_;
  pRVar4 = (this->sentence_).ptr_ + (this->sentence_).size_;
  __k = pRVar1;
  if (pRVar1 != pRVar4) {
    do {
      p_Var3 = std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::_M_find_before_node
                         (&this->symbols_->_M_h,
                          (ulong)__k->rune % (this->symbols_->_M_h)._M_bucket_count,&__k->rune,
                          (ulong)__k->rune);
      if ((p_Var3 != (__node_base_ptr)0x0) && (p_Var3->_M_nxt != (_Hash_node_base *)0x0)) {
        if (pRVar1 == this->cursor_) {
          this->cursor_ = this->cursor_ + 1;
        }
        pRVar4 = this->cursor_;
        break;
      }
      sVar2 = (this->sentence_).size_;
      __k = this->cursor_ + 1;
      this->cursor_ = __k;
      pRVar4 = (this->sentence_).ptr_ + sVar2;
    } while (__k != pRVar4);
  }
  RVar5.end = pRVar4;
  RVar5.begin = pRVar1;
  return RVar5;
}

Assistant:

Range Next() {
    Range range;
    range.begin = cursor_;
    while (cursor_ != sentence_.end()) {
      if (IsIn(symbols_, cursor_->rune)) {
        if (range.begin == cursor_) {
          cursor_ ++;
        }
        range.end = cursor_;
        return range;
      }
      cursor_ ++;
    }
    range.end = sentence_.end();
    return range;
  }